

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O0

void __thiscall TLeonardoHeap<double>::insertion_sort(TLeonardoHeap<double> *this,size_t element)

{
  size_t element_local;
  TLeonardoHeap<double> *this_local;
  
  if (((this->tree_vector & 1) == 0) || ((this->tree_vector & 2) == 0)) {
    if (this->first_tree == 1) {
      this->tree_vector = this->tree_vector << 1 | 1;
      this->first_tree = 0;
    }
    else {
      this->tree_vector = this->tree_vector << ((char)this->first_tree - 1U & 0x3f) | 1;
      this->first_tree = 1;
    }
  }
  else {
    this->tree_vector = this->tree_vector >> 2 | 1;
    this->first_tree = this->first_tree + 2;
  }
  filter(this,element,(ulong)this->first_tree,true);
  return;
}

Assistant:

inline void TLeonardoHeap<T>::insertion_sort(size_t element) {
	if((tree_vector & 1) && (tree_vector & 2)) {	// Smallest two trees are of sequential order
		// Insert a tree of order L_{k+2} with the new element as the root
		tree_vector = (tree_vector >> 2) | 1;
		first_tree += 2;
	} else if(first_tree == 1) {
		// Insert a singleton node of order L_0
		tree_vector = (tree_vector << 1) | 1;
		first_tree = 0;
	} else {
		// Insert a singleton node of order L_1
		tree_vector = (tree_vector << (first_tree-1)) | 1;
		first_tree = 1;
	}
	// Filter leftwards to restore ascending root and max-heap properties
	filter(element, first_tree);
}